

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O3

void __thiscall
dynet::SparsemaxLoss::forward_dev_impl<dynet::Device_CPU>
          (SparsemaxLoss *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  float *pfVar1;
  float fVar2;
  Tensor *pTVar3;
  void *pvVar4;
  StoragePointerType pfVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  float *pfVar8;
  runtime_error *prVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  _Type alVar16;
  StoragePointerType pfVar18;
  long lVar19;
  ulong uVar20;
  CoeffReturnType CVar21;
  CoeffReturnType CVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  SumReducer<float> reducer;
  ostringstream oss;
  SumReducer<float> local_226;
  undefined1 local_225 [5];
  Tensor *local_220;
  float local_214;
  ulong local_210;
  undefined8 local_208;
  array<long,_1> aStack_200;
  StoragePointerType local_1f8;
  Dimensions local_1f0;
  scalar_constant_op<float> local_1e8;
  float *local_1d8;
  Dimensions local_1d0;
  bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_> local_1c0;
  float *local_1a8;
  float *pfStack_1a0;
  _Type local_198;
  undefined1 local_190 [24];
  array<long,_1> local_178;
  array<Index,_NumReducedDims> local_170;
  array<Index,_NumReducedDims> local_168;
  bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_> local_160;
  DefaultDevice *local_150;
  ulong local_148;
  _Type local_140;
  Dimensions local_138;
  Dimensions local_130;
  _Type local_128;
  Dimensions local_118;
  EvaluatorPointerType local_c0;
  XprType *local_b8;
  array<long,_1> aVar17;
  
  pTVar3 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_220 = fx;
  if ((1 < (pTVar3->d).nd) && ((pTVar3->d).d[1] != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"SparsemaxLoss not yet implemented for multiple columns",0x36);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_208);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = (pTVar3->d).d[0];
  if (0x10000 < (long)(int)uVar10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.",0x47);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_208);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar20 = (ulong)((long)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  local_214 = (float)(uVar20 & 0xffffffff);
  pvVar4 = (this->super_Node).aux_mem;
  local_225._1_4_ = 1.0 / local_214;
  std::__partial_sort_copy<float*,float*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<float>>>
            (pTVar3->v,pTVar3->v + (int)uVar10,pvVar4);
  uVar11 = 0;
  uVar7 = 0;
  if (0 < (int)uVar10) {
    uVar7 = (ulong)uVar10;
  }
  fVar23 = 0.0;
  do {
    fVar24 = fVar23;
    if (uVar7 == uVar11) goto LAB_003fe3b8;
    fVar2 = *(float *)((long)pvVar4 + uVar11 * 4);
    fVar23 = fVar24 + fVar2;
    uVar11 = uVar11 + 1;
  } while (fVar23 < (float)(int)uVar11 * fVar2 + 1.0);
  uVar7 = (ulong)((int)uVar11 - 1);
LAB_003fe3b8:
  fVar23 = (fVar24 + -1.0) / (float)(int)uVar7;
  pTVar3 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pfStack_1a0 = pTVar3->v;
  uVar10 = 1;
  if ((pTVar3->d).nd != 0) {
    uVar10 = (pTVar3->d).d[0];
  }
  pfVar5 = (StoragePointerType)(this->super_Node).aux_mem;
  aStack_200._M_elems[0] = (_Type)(long)(int)uVar10;
  local_1a8 = (float *)CONCAT44(local_1a8._4_4_,fVar23);
  local_208 = (StoragePointerType)((ulong)local_208._4_4_ << 0x20);
  uVar13 = uVar10 + 0xf;
  if (-1 < (int)uVar10) {
    uVar13 = uVar10;
  }
  lVar14 = (long)((int)uVar13 >> 4) * 0x10;
  if (0xf < (int)uVar10) {
    lVar15 = 0;
    pfVar8 = pfStack_1a0;
    pfVar18 = pfVar5;
    do {
      lVar19 = 0;
      do {
        pfVar1 = (float *)((long)pfVar8 + lVar19);
        auVar25._4_4_ = pfVar1[1] - fVar23;
        auVar25._0_4_ = *pfVar1 - fVar23;
        auVar25._8_4_ = pfVar1[2] - fVar23;
        auVar25._12_4_ = pfVar1[3] - fVar23;
        auVar25 = maxps(ZEXT816(0) << 0x40,auVar25);
        *(undefined1 (*) [16])((long)pfVar18 + lVar19) = auVar25;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x40);
      lVar15 = lVar15 + 0x10;
      pfVar18 = pfVar18 + 0x10;
      pfVar8 = pfVar8 + 0x10;
    } while (lVar15 < lVar14);
  }
  aVar17._M_elems[0] = (_Type)(long)((long)aStack_200._M_elems[0] + 3);
  if (-1 < (long)aStack_200._M_elems[0]) {
    aVar17._M_elems[0] = aStack_200._M_elems[0];
  }
  alVar16[0] = aVar17._M_elems[0] & 0xfffffffffffffffc;
  for (; lVar14 < alVar16[0]; lVar14 = lVar14 + 4) {
    pfVar8 = pfStack_1a0 + lVar14;
    auVar6._4_4_ = pfVar8[1] - fVar23;
    auVar6._0_4_ = *pfVar8 - fVar23;
    auVar6._8_4_ = pfVar8[2] - fVar23;
    auVar6._12_4_ = pfVar8[3] - fVar23;
    auVar25 = maxps(ZEXT816(0) << 0x40,auVar6);
    *(undefined1 (*) [16])(pfVar5 + lVar14) = auVar25;
  }
  if (alVar16[0] < (long)aStack_200._M_elems[0]) {
    if (pfStack_1a0 == (float *)0x0) {
      pcVar12 = 
      "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
      ;
      aStack_200._M_elems[0] = (_Type)(_Type)&local_226;
      goto LAB_003fe865;
    }
    if (pfVar5 == (StoragePointerType)0x0) {
      pcVar12 = 
      "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
      ;
      aStack_200._M_elems[0] = (_Type)(_Type)&local_226;
      goto LAB_003fe735;
    }
    do {
      fVar24 = 0.0;
      if (0.0 <= pfStack_1a0[alVar16[0]] - fVar23) {
        fVar24 = pfStack_1a0[alVar16[0]] - fVar23;
      }
      pfVar5[alVar16[0]] = fVar24;
      alVar16[0] = alVar16[0] + 1;
    } while (aStack_200._M_elems[0] != (_Type)alVar16[0]);
  }
  pTVar3 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_1d8 = pTVar3->v;
  uVar10 = 1;
  if ((pTVar3->d).nd != 0) {
    uVar10 = (pTVar3->d).d[0];
  }
  local_1d0.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)uVar10;
  local_1c0.m_value = fVar23 * fVar23;
  local_1e8.m_other = 0.0;
  local_1a8 = local_220->v;
  local_210 = uVar20;
  local_208 = pfVar5;
  local_1f8 = pfVar5;
  local_1f0.super_array<long,_1>._M_elems[0] =
       (array<long,_1>)(array<long,_1>)aStack_200._M_elems[0];
  local_198[0] = (long)local_225;
  Eigen::
  TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
  ::TensorEvaluator((TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                     *)&local_160,(XprType *)&local_208,(DefaultDevice *)local_225);
  local_c0 = (EvaluatorPointerType)0x0;
  local_190[0] = 1;
  local_168._M_elems[0] = (_Type)(_Type)local_138.super_array<long,_1>._M_elems[0];
  local_170._M_elems[0] = (_Type)1;
  local_190._8_8_ = local_138.super_array<long,_1>._M_elems[0];
  local_178._M_elems[0] = (_Type)(_Type)local_138.super_array<long,_1>._M_elems[0];
  local_b8 = (XprType *)local_225;
  CVar21 = Eigen::internal::
           InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_true,_true>
           ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)4>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float,_float>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                     *)local_190,0,(Index)local_138.super_array<long,_1>._M_elems[0],&local_226);
  uVar7 = local_210;
  if (local_1a8 == (float *)0x0) {
LAB_003fe720:
    pcVar12 = 
    "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
    ;
LAB_003fe735:
    __assert_fail("m_data != __null",
                  "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100,
                  pcVar12);
  }
  *local_1a8 = CVar21;
  if (local_c0 != (EvaluatorPointerType)0x0) {
    free(local_c0);
  }
  pfVar8 = local_220->v;
  if (pfVar8 != (float *)0x0) {
    *pfVar8 = ((float)local_225._1_4_ * (float)local_225._1_4_ * local_214 + *pfVar8) * 0.5;
    if ((int)uVar7 == 0) {
LAB_003fe703:
      fVar23 = 0.0;
      if (0.0 <= *pfVar8) {
        fVar23 = *pfVar8;
      }
      *pfVar8 = fVar23;
      return;
    }
    uVar11 = 0;
    do {
      pTVar3 = *(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar10 = 1;
      if ((pTVar3->d).nd != 0) {
        uVar10 = (pTVar3->d).d[0];
      }
      local_1a8 = local_220->v;
      local_138.super_array<long,_1>._M_elems[0] = (array<long,_1>)pTVar3->v;
      local_130.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)uVar10;
      uVar20 = (ulong)(this->pq->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar11];
      local_160.m_value = (second_argument_type)local_225._1_4_;
      local_198[0] = (long)&local_208;
      local_190._0_8_ = &local_208;
      local_190._16_8_ = local_1a8;
      local_170._M_elems[0] = (_Type)(_Type)&local_208;
      local_168._M_elems[0] = (_Type)(_Type)&local_208;
      local_128[0] = (long)&local_208;
      local_118.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)&local_208;
      if ((long)local_130.super_array<long,_1>._M_elems[0] <= (long)uVar20) {
        __assert_fail("op.offset() < input_dims[m_dim.actualDim()]",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorChipping.h",0xae
                      ,
                      "Eigen::TensorEvaluator<const Eigen::TensorChippingOp<0, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Eigen::DefaultDevice>::TensorEvaluator(const XprType &, const Device &) [Derived = const Eigen::TensorChippingOp<0, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Device = Eigen::DefaultDevice]"
                     );
      }
      local_150 = (DefaultDevice *)0x1;
      local_148 = uVar20;
      local_140[0] = (long)local_130.super_array<long,_1>._M_elems[0];
      CVar22 = Eigen::
               TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
               ::coeff((TensorEvaluator<const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_product_op<float,_float>_>,_const_Eigen::TensorChippingOp<0L,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice>
                        *)local_190,0);
      if (local_1a8 == (float *)0x0) goto LAB_003fe720;
      *local_1a8 = CVar22;
      uVar11 = uVar11 + 1;
    } while ((uVar7 & 0xffffffff) != uVar11);
    pfVar8 = local_220->v;
    if (pfVar8 != (float *)0x0) goto LAB_003fe703;
  }
  pcVar12 = 
  "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
  ;
LAB_003fe865:
  __assert_fail("m_data != __null",
                "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",0x123,
                pcVar12);
}

Assistant:

void SparsemaxLoss::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#ifdef __CUDACC__
    DYNET_NO_CUDA_IMPL_ERROR("SparsemaxLoss forward");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS)
      DYNET_RUNTIME_ERR("MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.");
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    int k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem, xs[0]->device, DeviceMempool::FXS);
    tsm.t<1>() = (xs[0]->t<1>() - tau).cwiseMax(0.f);
    fx.t<0>() = ( (tsm.t<1>() != 0.f).cast<float>() * (xs[0]->t<1>().square() - (tau * tau)) ).sum();
    fx.t<0>() = ( fx.t<0>() + qprop * qprop * qsupport_size ) / 2.f;
    for (unsigned i = 0; i < qsupport_size; ++i)
      fx.t<0>() = fx.t<0>() - xs[0]->t<1>().chip<0>((*pq)[i]) * qprop;
    fx.t<0>() = fx.t<0>().cwiseMax(0.f);
#endif
  } else {
    DYNET_RUNTIME_ERR("SparsemaxLoss not yet implemented for multiple columns");
  }
}